

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O3

void __thiscall
tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<int,int,float>
          (Vector<glm::vec<3,float,(glm::qualifier)0>> *this,int *args,int *args_1,float *args_2)

{
  float fVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = *(long *)(this + 8);
  if (lVar3 == *(long *)(this + 0x10)) {
    Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::grow
              ((Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *)this,lVar3 + 1);
    lVar3 = *(long *)(this + 8);
  }
  lVar2 = *(long *)this;
  fVar1 = *args_2;
  *(ulong *)(lVar2 + lVar3 * 0xc) = CONCAT44((float)*args_1,(float)*args);
  *(float *)(lVar2 + 8 + lVar3 * 0xc) = fVar1;
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  return;
}

Assistant:

void Vector<T>::emplace_back(Args&&... args)noexcept
{
    if(_size == _capacity)
        grow(_capacity+1);
    new ((void*)&_data[_size]) T(tl::forward<Args>(args)...);
    _size++;
}